

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl.h
# Opt level: O2

size_t flatbuffers::SizeOf(BaseType t)

{
  if (t < (BASE_TYPE_VECTOR64|BASE_TYPE_UTYPE)) {
    return *(size_t *)(&DAT_0013f278 + (ulong)t * 8);
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/idl.h"
                ,0x9f,"size_t flatbuffers::SizeOf(const BaseType)");
}

Assistant:

inline size_t SizeOf(const BaseType t) {
  switch (t) {
  #define FLATBUFFERS_TD(ENUM, IDLTYPE, CTYPE, ...) \
    case BASE_TYPE_##ENUM: return sizeof(CTYPE);
      FLATBUFFERS_GEN_TYPES(FLATBUFFERS_TD)
  #undef FLATBUFFERS_TD
    default: FLATBUFFERS_ASSERT(0);
  }
  return 0;
}